

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quick_packet.cc
# Opt level: O2

void __thiscall QuickPacket::QuickPacket(QuickPacket *this,QuickPacket *other)

{
  ushort uVar1;
  pointer __p;
  
  this->_sequence_number = 0;
  this->_packet_number = 0;
  (this->_data)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
  this->_data_len = 0;
  this->_acked = false;
  __p = (pointer)operator_new__(0x578);
  std::__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char>_>::reset
            ((__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char>_> *)&this->_data,__p
            );
  uVar1 = other->_data_len;
  this->_data_len = uVar1;
  memcpy((this->_data)._M_t.
         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
         (other->_data)._M_t.
         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,(ulong)uVar1);
  this->_pkt_sent_time = other->_pkt_sent_time;
  this->_sequence_number = other->_sequence_number;
  return;
}

Assistant:

QuickPacket::QuickPacket(const QuickPacket* other)
{
	_data.reset(new uint8_t[MAX_PKT_LEN]);
	_data_len = other->_data_len;
	memcpy(_data.get(), other->_data.get(), _data_len);
	_pkt_sent_time = other->_pkt_sent_time;
	_sequence_number = other->_sequence_number;
}